

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O1

Type * __thiscall
JsUtil::
List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
::AllocArray(List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *this,int size)

{
  undefined1 auVar1 [16];
  Type *pTVar2;
  size_t byteSize;
  long lVar3;
  
  if (size != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)size;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(0x18),0);
    }
    lVar3 = 0;
    pTVar2 = (Type *)new__<Memory::JitArenaAllocator>
                               (byteSize,(this->
                                         super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                                         ).alloc,0x3f1274);
    do {
      (&pTVar2->initialized)[lVar3] = false;
      lVar3 = lVar3 + 0x18;
    } while ((long)size * 0x18 != lVar3);
    return pTVar2;
  }
  return (Type *)&DAT_00000008;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}